

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameWalkWith(Walker *pWalker,Select *pSelect)

{
  int iVar1;
  int iVar2;
  Parse *pParse;
  Select *p;
  With *pWith;
  long lVar3;
  Select **ppSVar4;
  long in_FS_OFFSET;
  With *local_80;
  NameContext local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pSelect != (Select *)0x0) {
    pParse = pWalker->pParse;
    if ((pSelect->pEList->nAlloc & 0x40) == 0) {
      pWith = sqlite3WithDup(pParse->db,(With *)pSelect);
      local_80 = sqlite3WithPush(pParse,pWith,'\x01');
    }
    else {
      local_80 = (With *)0x0;
    }
    iVar1._0_1_ = pSelect->op;
    iVar1._1_1_ = pSelect->field_0x1;
    iVar1._2_2_ = pSelect->nSelectRow;
    if (0 < iVar1) {
      ppSVar4 = (Select **)&pSelect->pEList;
      lVar3 = 0;
      do {
        p = *ppSVar4;
        local_70.ncFlags = 0;
        local_70.nNestedSelect = 0;
        local_70.pWinSelect = (Select *)0x0;
        local_70.pNext = (NameContext *)0x0;
        local_70.nRef = 0;
        local_70.nNcErr = 0;
        local_70.pSrcList = (SrcList *)0x0;
        local_70.uNC.pEList = (ExprList *)0x0;
        local_70.pParse = pParse;
        if (local_80 != (With *)0x0) {
          sqlite3SelectPrep(pParse,p,&local_70);
        }
        if ((local_70.pParse)->db->mallocFailed != '\0') goto LAB_00187352;
        sqlite3WalkSelect(pWalker,p);
        sqlite3RenameExprlistUnmap(pParse,(ExprList *)ppSVar4[-1]);
        lVar3 = lVar3 + 1;
        iVar2._0_1_ = pSelect->op;
        iVar2._1_1_ = pSelect->field_0x1;
        iVar2._2_2_ = pSelect->nSelectRow;
        ppSVar4 = ppSVar4 + 6;
      } while (lVar3 < iVar2);
    }
    if ((local_80 != (With *)0x0) && (pParse->pWith == local_80)) {
      pParse->pWith = local_80->pOuter;
    }
  }
LAB_00187352:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void renameWalkWith(Walker *pWalker, Select *pSelect){
  With *pWith = pSelect->pWith;
  if( pWith ){
    Parse *pParse = pWalker->pParse;
    int i;
    With *pCopy = 0;
    assert( pWith->nCte>0 );
    if( (pWith->a[0].pSelect->selFlags & SF_Expanded)==0 ){
      /* Push a copy of the With object onto the with-stack. We use a copy
      ** here as the original will be expanded and resolved (flags SF_Expanded
      ** and SF_Resolved) below. And the parser code that uses the with-stack
      ** fails if the Select objects on it have already been expanded and
      ** resolved.  */
      pCopy = sqlite3WithDup(pParse->db, pWith);
      pCopy = sqlite3WithPush(pParse, pCopy, 1);
    }
    for(i=0; i<pWith->nCte; i++){
      Select *p = pWith->a[i].pSelect;
      NameContext sNC;
      memset(&sNC, 0, sizeof(sNC));
      sNC.pParse = pParse;
      if( pCopy ) sqlite3SelectPrep(sNC.pParse, p, &sNC);
      if( sNC.pParse->db->mallocFailed ) return;
      sqlite3WalkSelect(pWalker, p);
      sqlite3RenameExprlistUnmap(pParse, pWith->a[i].pCols);
    }
    if( pCopy && pParse->pWith==pCopy ){
      pParse->pWith = pCopy->pOuter;
    }
  }
}